

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fFboNoAttachmentTests.cpp
# Opt level: O2

bool deqp::gles31::Functional::anon_unknown_0::checkFramebufferSize
               (TestLog *log,RenderContext *renderCtx,GLuint framebuffer,IVec2 *size)

{
  ostringstream *poVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  deUint32 err;
  undefined4 extraout_var;
  TestError *this;
  char *pcVar6;
  char *pcVar7;
  bool bVar8;
  GLuint outsideXPassed;
  GLuint insidePassed;
  GLuint vertexBuffer;
  GLuint vertexArray;
  GLuint outsideYPassed;
  GLuint query;
  float data [12];
  MessageBuilder local_280;
  ShaderProgram program;
  long lVar5;
  
  iVar4 = (*renderCtx->_vptr_RenderContext[3])(renderCtx);
  lVar5 = CONCAT44(extraout_var,iVar4);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)data,
             "#version 310 es\nin layout(location = 0) highp vec2 a_position;\n\nvoid main()\n{\n\tgl_Position = vec4(a_position, 0.0, 1.0);\n}\n"
             ,(allocator<char> *)&insidePassed);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&query,
             "#version 310 es\nuniform layout(location = 0) highp ivec2 u_expectedSize;\nout layout(location = 0) mediump vec4 f_color;\n\nvoid main()\n{\n\tif (ivec2(gl_FragCoord.xy) != u_expectedSize) discard;\n\tf_color = vec4(1.0, 0.5, 0.25, 1.0);\n}\n"
             ,(allocator<char> *)&outsideXPassed);
  glu::makeVtxFragSources((ProgramSources *)&local_280,(string *)data,(string *)&query);
  glu::ShaderProgram::ShaderProgram(&program,renderCtx,(ProgramSources *)&local_280);
  glu::ProgramSources::~ProgramSources((ProgramSources *)&local_280);
  std::__cxx11::string::~string((string *)&query);
  std::__cxx11::string::~string((string *)data);
  query = 0;
  insidePassed = 0;
  outsideXPassed = 0;
  outsideYPassed = 0;
  if (program.m_program.m_info.linkOk == false) {
    glu::operator<<(log,&program);
  }
  if ((program.m_program.m_info.linkOk & 1U) == 0) {
    this = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this,(char *)0x0,"program.isOk()",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fFboNoAttachmentTests.cpp"
               ,0x60);
  }
  else {
    (**(code **)(lVar5 + 0x1680))(program.m_program.m_program);
    (**(code **)(lVar5 + 0x5e0))(0xb71);
    (**(code **)(lVar5 + 0x4a0))(0x207);
    (**(code **)(lVar5 + 0x78))(0x8ca9,framebuffer);
    (**(code **)(lVar5 + 0x1a00))(0,0,size->m_data[0] * 2,size->m_data[1] * 2);
    poVar1 = &local_280.m_str;
    local_280.m_log = log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,"Using ");
    std::ostream::operator<<(poVar1,size->m_data[0] * 2);
    std::operator<<((ostream *)poVar1,"x");
    std::ostream::operator<<(poVar1,size->m_data[1] * 2);
    std::operator<<((ostream *)poVar1," viewport");
    tcu::MessageBuilder::operator<<(&local_280,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
    poVar1 = &local_280.m_str;
    local_280.m_log = log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,"Discarding fragments outside pixel of interest");
    tcu::MessageBuilder::operator<<(&local_280,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
    poVar1 = &local_280.m_str;
    local_280.m_log = log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,"Using occlusion query to check for rendered fragments");
    tcu::MessageBuilder::operator<<(&local_280,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
    iVar4 = (**(code **)(lVar5 + 0x170))(0x8ca9);
    if (iVar4 == 0x8cd5) {
      data[8] = 1.0;
      data[9] = -1.0;
      data[10] = -1.0;
      data[0xb] = -1.0;
      data[4] = -1.0;
      data[5] = 1.0;
      data[6] = -1.0;
      data[7] = 1.0;
      vertexArray = 0;
      data[0] = 1.0;
      data[1] = 1.0;
      data[2] = 1.0;
      data[3] = -1.0;
      vertexBuffer = 0;
      (**(code **)(lVar5 + 0x6e0))(1,&query);
      (**(code **)(lVar5 + 0x708))(1,&vertexArray);
      (**(code **)(lVar5 + 0xd8))(vertexArray);
      (**(code **)(lVar5 + 0x6c8))(1,&vertexBuffer);
      (**(code **)(lVar5 + 0x40))(0x8892,vertexBuffer);
      (**(code **)(lVar5 + 0x150))(0x8892,0x30,data,0x88e4);
      (**(code **)(lVar5 + 0x610))(0);
      (**(code **)(lVar5 + 0x19f0))(0,2,0x1406,0,0,0);
      (**(code **)(lVar5 + 0x1530))(0,size->m_data[0] + -1,size->m_data[1] + -1);
      (**(code **)(lVar5 + 0x20))(0x8c2f,query);
      (**(code **)(lVar5 + 0x538))(4,0,6);
      (**(code **)(lVar5 + 0x628))(0x8c2f);
      (**(code **)(lVar5 + 0xa20))(query,0x8866,&insidePassed);
      poVar1 = &local_280.m_str;
      local_280.m_log = log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
      std::operator<<((ostream *)poVar1,"A fragment was not discarded at (");
      std::ostream::operator<<(poVar1,size->m_data[0] + -1);
      std::operator<<((ostream *)poVar1,", ");
      std::ostream::operator<<(poVar1,size->m_data[1] + -1);
      std::operator<<((ostream *)poVar1,"). ");
      std::operator<<((ostream *)poVar1,"Occlusion query reports it was ");
      pcVar7 = "rendered.";
      pcVar6 = "rendered.";
      if (insidePassed == 0) {
        pcVar6 = "not rendered";
      }
      std::operator<<((ostream *)poVar1,pcVar6);
      tcu::MessageBuilder::operator<<(&local_280,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
      (**(code **)(lVar5 + 0x1530))(0,size->m_data[0],size->m_data[1] + -1);
      (**(code **)(lVar5 + 0x20))(0x8c2f,query);
      (**(code **)(lVar5 + 0x538))(4,0,6);
      (**(code **)(lVar5 + 0x628))(0x8c2f);
      (**(code **)(lVar5 + 0xa20))(query,0x8866,&outsideXPassed);
      poVar1 = &local_280.m_str;
      local_280.m_log = log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
      std::operator<<((ostream *)poVar1,"A fragment was not discarded at (");
      std::ostream::operator<<(poVar1,size->m_data[0]);
      std::operator<<((ostream *)poVar1,", ");
      std::ostream::operator<<(poVar1,size->m_data[1] + -1);
      std::operator<<((ostream *)poVar1,"). ");
      std::operator<<((ostream *)poVar1,"Occlusion query reports it was ");
      pcVar6 = "rendered.";
      if (outsideXPassed == 0) {
        pcVar6 = "not rendered";
      }
      std::operator<<((ostream *)poVar1,pcVar6);
      tcu::MessageBuilder::operator<<(&local_280,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
      (**(code **)(lVar5 + 0x1530))(0,size->m_data[0] + -1,size->m_data[1]);
      (**(code **)(lVar5 + 0x20))(0x8c2f,query);
      (**(code **)(lVar5 + 0x538))(4,0,6);
      (**(code **)(lVar5 + 0x628))(0x8c2f);
      (**(code **)(lVar5 + 0xa20))(query,0x8866,&outsideYPassed);
      poVar1 = &local_280.m_str;
      local_280.m_log = log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
      std::operator<<((ostream *)poVar1,"A fragment was not discarded at (");
      std::ostream::operator<<(poVar1,size->m_data[0] + -1);
      std::operator<<((ostream *)poVar1,", ");
      std::ostream::operator<<(poVar1,size->m_data[1]);
      std::operator<<((ostream *)poVar1,"). ");
      std::operator<<((ostream *)poVar1,"Occlusion query reports it was ");
      if (outsideYPassed == 0) {
        pcVar7 = "not rendered";
      }
      std::operator<<((ostream *)poVar1,pcVar7);
      tcu::MessageBuilder::operator<<(&local_280,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
      (**(code **)(lVar5 + 0x518))(0);
      (**(code **)(lVar5 + 0x40))(0x8892,0);
      (**(code **)(lVar5 + 0xd8))(0);
      (**(code **)(lVar5 + 0x438))(1,&vertexBuffer);
      (**(code **)(lVar5 + 0x490))(1,&vertexArray);
      (**(code **)(lVar5 + 0x458))(1,&query);
      err = (**(code **)(lVar5 + 0x800))();
      glu::checkError(err,"Query failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fFboNoAttachmentTests.cpp"
                      ,0xa9);
      bVar8 = insidePassed != 0;
      bVar2 = outsideYPassed == 0;
      bVar3 = outsideXPassed == 0;
      glu::ShaderProgram::~ShaderProgram(&program);
      return (bVar2 && bVar3) && bVar8;
    }
    this = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this,(char *)0x0,
               "gl.checkFramebufferStatus(GL_DRAW_FRAMEBUFFER) == GL_FRAMEBUFFER_COMPLETE",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fFboNoAttachmentTests.cpp"
               ,0x6c);
  }
  __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

bool checkFramebufferSize (TestLog& log, const glu::RenderContext& renderCtx, GLuint framebuffer, const IVec2& size)
{
	const glw::Functions&		gl				= renderCtx.getFunctions();

	const char* const			vertexSource	= "#version 310 es\n"
												  "in layout(location = 0) highp vec2 a_position;\n\n"
												  "void main()\n"
												  "{\n"
												  "	gl_Position = vec4(a_position, 0.0, 1.0);\n"
												  "}\n";

	const char* const			fragmentSource	= "#version 310 es\n"
												  "uniform layout(location = 0) highp ivec2 u_expectedSize;\n"
												  "out layout(location = 0) mediump vec4 f_color;\n\n"
												  "void main()\n"
												  "{\n"
												  "	if (ivec2(gl_FragCoord.xy) != u_expectedSize) discard;\n"
												  "	f_color = vec4(1.0, 0.5, 0.25, 1.0);\n"
												  "}\n";

	const glu::ShaderProgram	program			(renderCtx, glu::makeVtxFragSources(vertexSource, fragmentSource));
	GLuint						query			= 0;
	GLuint						insidePassed	= 0;
	GLuint						outsideXPassed	= 0;
	GLuint						outsideYPassed	= 0;

	if (!program.isOk())
		log << program;

	TCU_CHECK(program.isOk());

	gl.useProgram(program.getProgram());
	gl.enable(GL_DEPTH_TEST);
	gl.depthFunc(GL_ALWAYS);
	gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, framebuffer);
	gl.viewport(0, 0, size.x()*2, size.y()*2); // Oversized viewport so that it will not accidentally limit us to the correct size

	log << TestLog::Message << "Using " << size.x()*2 << "x" << size.y()*2 << " viewport" << TestLog::EndMessage;
	log << TestLog::Message << "Discarding fragments outside pixel of interest" << TestLog::EndMessage;
	log << TestLog::Message << "Using occlusion query to check for rendered fragments" << TestLog::EndMessage;

	TCU_CHECK(gl.checkFramebufferStatus(GL_DRAW_FRAMEBUFFER) == GL_FRAMEBUFFER_COMPLETE);

	// Render
	{
		const float data[] =
		{
			 1.0f,  1.0f,
			 1.0f, -1.0f,
			-1.0f,  1.0f,
			-1.0f,  1.0f,
			 1.0f, -1.0f,
			-1.0f, -1.0f,
		};

		GLuint vertexArray	= 0;
		GLuint vertexBuffer	= 0;

		gl.genQueries(1, &query);
		gl.genVertexArrays(1, &vertexArray);
		gl.bindVertexArray(vertexArray);

		gl.genBuffers(1, &vertexBuffer);
		gl.bindBuffer(GL_ARRAY_BUFFER, vertexBuffer);
		gl.bufferData(GL_ARRAY_BUFFER, sizeof(data), data, GL_STATIC_DRAW);

		gl.enableVertexAttribArray(0);
		gl.vertexAttribPointer(0, 2, GL_FLOAT, false, 0, DE_NULL);

		gl.uniform2i(0, size.x()-1, size.y()-1);
		gl.beginQuery(GL_ANY_SAMPLES_PASSED, query);
		gl.drawArrays(GL_TRIANGLES, 0, 6);
		gl.endQuery(GL_ANY_SAMPLES_PASSED);
		gl.getQueryObjectuiv(query, GL_QUERY_RESULT, &insidePassed);
		log << TestLog::Message << "A fragment was not discarded at (" << size.x()-1 << ", " << size.y()-1 << "). "
			<< "Occlusion query reports it was " << (insidePassed > 0 ? "rendered." : "not rendered") << TestLog::EndMessage;

		gl.uniform2i(0, size.x(), size.y()-1);
		gl.beginQuery(GL_ANY_SAMPLES_PASSED, query);
		gl.drawArrays(GL_TRIANGLES, 0, 6);
		gl.endQuery(GL_ANY_SAMPLES_PASSED);
		gl.getQueryObjectuiv(query, GL_QUERY_RESULT, &outsideXPassed);
		log << TestLog::Message << "A fragment was not discarded at (" << size.x() << ", " << size.y()-1 << "). "
			<< "Occlusion query reports it was " << (outsideXPassed > 0 ? "rendered." : "not rendered") << TestLog::EndMessage;

		gl.uniform2i(0, size.x()-1, size.y());
		gl.beginQuery(GL_ANY_SAMPLES_PASSED, query);
		gl.drawArrays(GL_TRIANGLES, 0, 6);
		gl.endQuery(GL_ANY_SAMPLES_PASSED);
		gl.getQueryObjectuiv(query, GL_QUERY_RESULT, &outsideYPassed);
		log << TestLog::Message << "A fragment was not discarded at (" << size.x()-1 << ", " << size.y() << "). "
			<< "Occlusion query reports it was " << (outsideYPassed > 0 ? "rendered." : "not rendered") << TestLog::EndMessage;

		gl.disableVertexAttribArray(0);
		gl.bindBuffer(GL_ARRAY_BUFFER, 0);
		gl.bindVertexArray(0);
		gl.deleteBuffers(1, &vertexBuffer);
		gl.deleteVertexArrays(1, &vertexArray);
	}

	gl.deleteQueries(1, &query);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Query failed");

	return insidePassed && !outsideXPassed && !outsideYPassed;
}